

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tests.c
# Opt level: O1

void test_modinv32_uint16(uint16_t *out,uint16_t *in,uint16_t *mod)

{
  uint *puVar1;
  ulong *puVar2;
  ushort *puVar3;
  int32_t *piVar4;
  long lVar5;
  int iVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  undefined1 auVar12 [16];
  undefined1 auVar13 [16];
  bool bVar14;
  uint uVar15;
  int iVar16;
  uint uVar17;
  uint64_t uVar18;
  long lVar19;
  byte bVar20;
  int iVar21;
  code *m_00;
  ulong uVar22;
  code *pcVar23;
  ulong unaff_RBP;
  uint uVar24;
  secp256k1_modinv32_modinfo *modinfo;
  secp256k1_modinv64_modinfo *psVar25;
  secp256k1_modinv64_modinfo *out_00;
  secp256k1_modinv64_modinfo *a;
  secp256k1_modinv64_signed62 *psVar26;
  secp256k1_modinv64_signed62 *psVar27;
  uint16_t *out_01;
  int iVar28;
  ulong uVar29;
  ulong uVar30;
  uint uVar31;
  int iVar32;
  code *unaff_R13;
  undefined8 uVar33;
  int iVar34;
  secp256k1_modinv32_signed30 x;
  secp256k1_modinv32_modinfo m;
  uint16_t tmp [16];
  uint16_t negone [16];
  int iStack_284;
  secp256k1_modinv32_trans2x2 sStack_278;
  undefined8 uStack_268;
  secp256k1_modinv32_signed30 sStack_260;
  int iStack_234;
  secp256k1_modinv32_signed30 sStack_230;
  code *pcStack_208;
  ulong uStack_200;
  undefined8 uStack_1f8;
  secp256k1_modinv32_modinfo *psStack_1f0;
  secp256k1_modinv64_modinfo *psStack_1e8;
  code *pcStack_1e0;
  code *pcStack_1d8;
  secp256k1_modinv64_signed62 sStack_1d0;
  ulong uStack_1a8;
  secp256k1_modinv64_modinfo sStack_1a0;
  uint16_t auStack_170 [20];
  code *pcStack_148;
  uint16_t uStack_140;
  undefined8 uStack_13e;
  undefined6 uStack_136;
  undefined2 uStack_130;
  undefined6 uStack_12e;
  undefined8 uStack_128;
  uint16_t *puStack_118;
  ulong uStack_110;
  code *pcStack_108;
  uint16_t *puStack_100;
  uint16_t *puStack_f8;
  code *pcStack_f0;
  secp256k1_modinv64_modinfo local_e8;
  secp256k1_modinv32_modinfo local_b8;
  secp256k1_modinv64_modinfo local_88;
  uint16_t local_58;
  undefined8 local_56;
  undefined6 uStack_4e;
  undefined2 uStack_48;
  undefined6 uStack_46;
  undefined8 uStack_40;
  
  psVar25 = &local_e8;
  a = &local_e8;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar15 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar15 / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((in[uVar15 >> 4] >> (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  uVar31 = local_e8.modulus.v[0]._4_4_ | (uint)local_e8.modulus.v[0] | (uint)local_e8.modulus.v[1] |
           local_e8.modulus.v[1]._4_4_ | (uint)local_e8.modulus.v[2] | local_e8.modulus.v[2]._4_4_ |
           (uint)local_e8.modulus.v[3] | local_e8.modulus.v[3]._4_4_ | (uint)local_e8.modulus.v[4];
  uVar29 = (ulong)uVar31;
  local_b8.modulus.v[0] = 0;
  local_b8.modulus.v[1] = 0;
  local_b8.modulus.v[2] = 0;
  local_b8.modulus.v[3] = 0;
  local_b8.modulus.v[4] = 0;
  local_b8.modulus.v[5] = 0;
  local_b8.modulus.v[6] = 0;
  local_b8.modulus.v[7] = 0;
  local_b8.modulus.v[8] = 0;
  uVar15 = 0;
  do {
    modinfo = (secp256k1_modinv32_modinfo *)((ulong)uVar15 / 0x1e);
    piVar4 = local_b8.modulus.v + (long)modinfo;
    *piVar4 = *piVar4 | (uint)((mod[uVar15 >> 4] >> (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  out_00 = (secp256k1_modinv64_modinfo *)(long)local_b8.modulus.v[0];
  pcStack_f0 = (code *)0x16e2e5;
  uVar18 = modinv2p64((uint64_t)out_00);
  local_b8.modulus_inv30 = (uint)uVar18 & 0x3fffffff;
  if (((uint)uVar18 * local_b8.modulus.v[0] & 0x3fffffff) != 1) goto LAB_0016e6b7;
  if (uVar31 == 0) {
LAB_0016e436:
    local_e8.modulus.v[2] = 0;
    local_e8.modulus.v[3] = 0;
    local_e8.modulus.v[0] = 0;
    local_e8.modulus.v[1] = 0;
    local_e8.modulus.v[4]._0_4_ = 0;
    uVar15 = 0;
    do {
      puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar15 / 0x1e) * 4);
      *puVar1 = *puVar1 | (uint)((in[uVar15 >> 4] >> (uVar15 & 0xf) & 1) != 0) <<
                          ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
      uVar15 = uVar15 + 1;
    } while (uVar15 != 0x100);
    local_88.modulus_inv62 = (uint64_t)mod;
    iVar16 = 0x10;
    do {
      uVar29 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
               secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) + secp256k1_test_state[0];
      uVar30 = uVar29 >> 0x1d;
      uVar29 = uVar29 >> 0x3d;
      iVar32 = local_b8.modulus.v[uVar29];
      if (iVar32 < 1) {
LAB_0016e508:
        if (iVar32 < 0) {
          uVar30 = uVar30 + 0x100000000 >> 0x20;
          iVar21 = local_b8.modulus.v[uVar30];
          if (0x3ffffffe < iVar21) {
            local_b8.modulus.v[uVar29] = iVar32 + 0x40000000;
            local_b8.modulus.v[uVar30] = iVar21 + -1;
          }
        }
      }
      else {
        uVar22 = uVar30 + 0x100000000 >> 0x20;
        iVar21 = local_b8.modulus.v[uVar22];
        if (0x3fffffff < iVar21) goto LAB_0016e508;
        local_b8.modulus.v[uVar29] = iVar32 + -0x40000000;
        local_b8.modulus.v[uVar22] = iVar21 + 1;
      }
      uVar22 = secp256k1_test_state[1] << 0x11;
      uVar30 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
      uVar29 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
      secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar30;
      secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar29;
      secp256k1_test_state[2] = uVar30 ^ uVar22;
      secp256k1_test_state[3] = uVar29 << 0x2d | uVar29 >> 0x13;
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    unaff_RBP = (ulong)(uVar31 != 0);
    mod = (uint16_t *)0x0;
    uVar29 = 0x88888889;
    while( true ) {
      iVar16 = (int)mod;
      unaff_R13 = secp256k1_modinv32_var;
      if (iVar16 == 0) {
        unaff_R13 = secp256k1_modinv32;
      }
      pcStack_f0 = (code *)0x16e5a3;
      (*unaff_R13)(&local_e8,&local_b8);
      out[8] = 0;
      out[9] = 0;
      out[10] = 0;
      out[0xb] = 0;
      out[0xc] = 0;
      out[0xd] = 0;
      out[0xe] = 0;
      out[0xf] = 0;
      out[0] = 0;
      out[1] = 0;
      out[2] = 0;
      out[3] = 0;
      out[4] = 0;
      out[5] = 0;
      out[6] = 0;
      out[7] = 0;
      uVar15 = 0;
      do {
        out[uVar15 >> 4] =
             out[uVar15 >> 4] |
             (ushort)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar15 / 0x1e) * 4) >>
                       uVar15 % 0x1e & 1) != 0) << ((byte)uVar15 & 0xf);
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x100);
      out_00 = &local_88;
      pcStack_f0 = (code *)0x16e5fe;
      modinfo = (secp256k1_modinv32_modinfo *)out;
      mulmod256((uint16_t *)out_00,out,in,(uint16_t *)local_88.modulus_inv62);
      if ((ushort)local_88.modulus.v[0] != (uVar31 != 0)) break;
      lVar19 = 1;
      do {
        if (*(short *)((long)local_88.modulus.v + lVar19 * 2) != 0) {
          pcStack_f0 = (code *)0x16e6ad;
          test_modinv32_uint16_cold_4();
          goto LAB_0016e6ad;
        }
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      pcStack_f0 = (code *)0x16e62e;
      out_00 = &local_e8;
      (*unaff_R13)(&local_e8,&local_b8);
      local_88.modulus.v[2] = 0;
      local_88.modulus.v[3] = 0;
      local_88.modulus.v[0] = 0;
      local_88.modulus.v[1] = 0;
      uVar15 = 0;
      do {
        uVar24 = (uint)((*(uint *)((long)local_e8.modulus.v + ((ulong)uVar15 / 0x1e) * 4) >>
                         uVar15 % 0x1e & 1) != 0) << ((byte)uVar15 & 0xf);
        modinfo = (secp256k1_modinv32_modinfo *)(ulong)uVar24;
        puVar3 = (ushort *)((long)local_88.modulus.v + (ulong)(uVar15 >> 4) * 2);
        *puVar3 = *puVar3 | (ushort)uVar24;
        uVar15 = uVar15 + 1;
      } while (uVar15 != 0x100);
      lVar19 = 0;
      do {
        if (*(uint16_t *)((long)local_88.modulus.v + lVar19 * 2) != in[lVar19]) goto LAB_0016e6ad;
        lVar19 = lVar19 + 1;
      } while (lVar19 != 0x10);
      mod = (uint16_t *)(ulong)(iVar16 + 1);
      if (iVar16 != 0) {
        return;
      }
    }
    goto LAB_0016e6b2;
  }
  pcStack_f0 = (code *)0x16e31e;
  mulmod256((uint16_t *)&local_88,in,in,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar15 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar15 / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar15 >> 4) * 2) >>
                                (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16e381;
  uVar15 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if (1 < uVar15) goto LAB_0016e6bc;
  local_58 = *mod - 1;
  local_56 = *(undefined8 *)(mod + 1);
  uStack_40 = *(undefined8 *)(mod + 0xc);
  uStack_4e = (undefined6)*(undefined8 *)(mod + 5);
  uStack_48 = (undefined2)*(undefined8 *)(mod + 8);
  uStack_46 = (undefined6)((ulong)*(undefined8 *)(mod + 8) >> 0x10);
  pcStack_f0 = (code *)0x16e3ba;
  mulmod256((uint16_t *)&local_88,(uint16_t *)&local_88,&local_58,mod);
  local_e8.modulus.v[2] = 0;
  local_e8.modulus.v[3] = 0;
  local_e8.modulus.v[0] = 0;
  local_e8.modulus.v[1] = 0;
  local_e8.modulus.v[4]._0_4_ = 0;
  uVar15 = 0;
  do {
    puVar1 = (uint *)((long)local_e8.modulus.v + ((ulong)uVar15 / 0x1e) * 4);
    *puVar1 = *puVar1 | (uint)((*(ushort *)((long)local_88.modulus.v + (ulong)(uVar15 >> 4) * 2) >>
                                (uVar15 & 0xf) & 1) != 0) <<
                        ((char)(uVar15 / 0x1e) * -0x1e + (char)uVar15 & 0x1fU);
    uVar15 = uVar15 + 1;
  } while (uVar15 != 0x100);
  modinfo = &local_b8;
  pcStack_f0 = (code *)0x16e41d;
  iVar16 = secp256k1_jacobi32_maybe_var((secp256k1_modinv32_signed30 *)&local_e8,modinfo);
  if ((iVar16 == 0) || (iVar16 == 1 - (*mod & 2))) goto LAB_0016e436;
LAB_0016e6c1:
  pcStack_f0 = test_modinv64_uint16;
  test_modinv32_uint16_cold_2();
  pcStack_f0 = (code *)unaff_RBP;
  puStack_f8 = out;
  puStack_100 = in;
  pcStack_108 = unaff_R13;
  uStack_110 = uVar29;
  puStack_118 = mod;
  psVar26 = &sStack_1d0;
  psVar27 = &sStack_1d0;
  sStack_1d0.v[0] = 0;
  sStack_1d0.v[1] = 0;
  sStack_1d0.v[2] = 0;
  sStack_1d0.v[3] = 0;
  sStack_1d0.v[4] = 0;
  uVar29 = 0;
  do {
    auVar7._8_8_ = 0;
    auVar7._0_8_ = uVar29 >> 1;
    puVar2 = (ulong *)((long)sStack_1d0.v +
                      (ulong)((uint)((uVar29 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8))
    ;
    *puVar2 = *puVar2 | (ulong)((*(ushort *)
                                  ((long)(modinfo->modulus).v + (uVar29 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)uVar29 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar7 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)uVar29 & 0x3fU);
    uVar29 = uVar29 + 1;
  } while ((int)uVar29 != 0x100);
  uVar29 = sStack_1d0.v[1] | sStack_1d0.v[0] | sStack_1d0.v[2] | sStack_1d0.v[3] | sStack_1d0.v[4];
  sStack_1a0.modulus.v[0] = 0;
  sStack_1a0.modulus.v[1] = 0;
  sStack_1a0.modulus.v[2] = 0;
  sStack_1a0.modulus.v[3] = 0;
  sStack_1a0.modulus.v[4] = 0;
  psVar25 = (secp256k1_modinv64_modinfo *)0x0;
  do {
    auVar8._8_8_ = 0;
    auVar8._0_8_ = (ulong)psVar25 >> 1;
    puVar2 = (ulong *)((long)sStack_1a0.modulus.v +
                      (ulong)((uint)(((ulong)psVar25 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                             0xfffffff8));
    *puVar2 = *puVar2 | (ulong)((*(ushort *)(m_00 + ((ulong)psVar25 >> 4 & 0xfffffff) * 2) >>
                                 ((uint)psVar25 & 0xf) & 1) != 0) <<
                        ((char)(SUB164(auVar8 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                         (char)psVar25 & 0x3fU);
    psVar25 = (secp256k1_modinv64_modinfo *)((long)(psVar25->modulus).v + 1);
  } while ((int)psVar25 != 0x100);
  uVar33 = 0x3fffffffffffffff;
  pcStack_1d8 = (code *)0x16e7f3;
  out_01 = (uint16_t *)sStack_1a0.modulus.v[0];
  uVar18 = modinv2p64(sStack_1a0.modulus.v[0]);
  sStack_1a0.modulus_inv62 = uVar18 & 0x3fffffffffffffff;
  pcVar23 = m_00;
  if ((uVar18 * sStack_1a0.modulus.v[0] & 0x3fffffffffffffff) == 1) {
    if (uVar29 == 0) {
LAB_0016e975:
      uStack_1a8 = uVar29;
      pcStack_148 = m_00;
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar29 = 0;
      do {
        auVar11._8_8_ = 0;
        auVar11._0_8_ = uVar29 >> 1;
        puVar2 = (ulong *)((long)sStack_1d0.v +
                          (ulong)((uint)((uVar29 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                 0xfffffff8));
        *puVar2 = *puVar2 | (ulong)((*(ushort *)
                                      ((long)(modinfo->modulus).v + (uVar29 >> 4 & 0xfffffff) * 2)
                                     >> ((uint)uVar29 & 0xf) & 1) != 0) <<
                            ((char)(SUB164(auVar11 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar29 & 0x3fU);
        uVar29 = uVar29 + 1;
      } while ((int)uVar29 != 0x100);
      iVar16 = 8;
      do {
        uVar30 = ((secp256k1_test_state[3] + secp256k1_test_state[0]) * 0x800000 |
                 secp256k1_test_state[3] + secp256k1_test_state[0] >> 0x29) +
                 secp256k1_test_state[0];
        uVar29 = uVar30 >> 0x1e;
        uVar30 = uVar30 >> 0x3e;
        lVar19 = sStack_1a0.modulus.v[uVar30];
        if (lVar19 < 1) {
LAB_0016ea78:
          if (lVar19 < 0) {
            uVar29 = uVar29 + 0x100000000 >> 0x20;
            lVar5 = sStack_1a0.modulus.v[uVar29];
            if (-0x4000000000000000 < lVar5) {
              sStack_1a0.modulus.v[uVar30] = lVar19 + 0x4000000000000000;
              sStack_1a0.modulus.v[uVar29] = lVar5 + -1;
            }
          }
        }
        else {
          uVar22 = uVar29 + 0x100000000 >> 0x20;
          lVar5 = sStack_1a0.modulus.v[uVar22];
          if (0x3fffffffffffffff < lVar5) goto LAB_0016ea78;
          sStack_1a0.modulus.v[uVar30] = lVar19 + -0x4000000000000000;
          sStack_1a0.modulus.v[uVar22] = lVar5 + 1;
        }
        uVar22 = secp256k1_test_state[1] << 0x11;
        uVar30 = secp256k1_test_state[2] ^ secp256k1_test_state[0];
        uVar29 = secp256k1_test_state[3] ^ secp256k1_test_state[1];
        secp256k1_test_state[1] = secp256k1_test_state[1] ^ uVar30;
        secp256k1_test_state[0] = secp256k1_test_state[0] ^ uVar29;
        secp256k1_test_state[2] = uVar30 ^ uVar22;
        secp256k1_test_state[3] = uVar29 << 0x2d | uVar29 >> 0x13;
        iVar16 = iVar16 + -1;
      } while (iVar16 != 0);
      uStack_1a8 = CONCAT44(uStack_1a8._4_4_,(uint)(uStack_1a8 != 0));
      uVar29 = 0;
      uVar33 = 0x84210843;
      while( true ) {
        iVar16 = (int)uVar29;
        pcVar23 = secp256k1_modinv64_var;
        if (iVar16 == 0) {
          pcVar23 = secp256k1_modinv64;
        }
        pcStack_1d8 = (code *)0x16eb2c;
        (*pcVar23)(&sStack_1d0);
        (a->modulus).v[2] = 0;
        (a->modulus).v[3] = 0;
        (a->modulus).v[0] = 0;
        (a->modulus).v[1] = 0;
        uVar30 = 0;
        do {
          auVar12._8_8_ = 0;
          auVar12._0_8_ = uVar30 >> 1;
          puVar3 = (ushort *)((long)(a->modulus).v + (uVar30 >> 4 & 0xfffffff) * 2);
          *puVar3 = *puVar3 | (ushort)((*(ulong *)((long)sStack_1d0.v +
                                                  (ulong)((uint)((uVar30 >> 1 & 0x7fffffff) *
                                                                 0x84210843 >> 0x21) & 0xfffffff8))
                                        >> ((ulong)((SUB164(auVar12 * ZEXT816(0x8421084210842109),8)
                                                    >> 4) * 2 + (int)uVar30) & 0x3f) & 1) != 0) <<
                              ((byte)uVar30 & 0xf);
          uVar30 = uVar30 + 1;
        } while ((int)uVar30 != 0x100);
        out_01 = auStack_170;
        pcStack_1d8 = (code *)0x16eb9c;
        psVar25 = a;
        mulmod256(out_01,(uint16_t *)a,(uint16_t *)modinfo,(uint16_t *)pcStack_148);
        if (auStack_170[0] != (uint16_t)uStack_1a8) break;
        lVar19 = 1;
        do {
          if (auStack_170[lVar19] != 0) {
            pcStack_1d8 = (code *)0x16ec67;
            test_modinv64_uint16_cold_4();
            goto LAB_0016ec67;
          }
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        pcStack_1d8 = (code *)0x16ebcf;
        (*pcVar23)(&sStack_1d0);
        auStack_170[8] = 0;
        auStack_170[9] = 0;
        auStack_170[10] = 0;
        auStack_170[0xb] = 0;
        auStack_170[0xc] = 0;
        auStack_170[0xd] = 0;
        auStack_170[0xe] = 0;
        auStack_170[0xf] = 0;
        auStack_170[0] = 0;
        auStack_170[1] = 0;
        auStack_170[2] = 0;
        auStack_170[3] = 0;
        auStack_170[4] = 0;
        auStack_170[5] = 0;
        auStack_170[6] = 0;
        auStack_170[7] = 0;
        psVar25 = (secp256k1_modinv64_modinfo *)0x0;
        do {
          auVar13._8_8_ = 0;
          auVar13._0_8_ = (ulong)psVar25 >> 1;
          out_01 = (uint16_t *)
                   ((ulong)((*(ulong *)((long)sStack_1d0.v +
                                       (ulong)((uint)(((ulong)psVar25 >> 1 & 0x7fffffff) *
                                                      0x84210843 >> 0x21) & 0xfffffff8)) >>
                             ((ulong)((SUB164(auVar13 * ZEXT816(0x8421084210842109),8) >> 4) * 2 +
                                     (int)psVar25) & 0x3f) & 1) != 0) << ((byte)psVar25 & 0xf));
          auStack_170[(ulong)psVar25 >> 4 & 0xfffffff] =
               auStack_170[(ulong)psVar25 >> 4 & 0xfffffff] | (ushort)out_01;
          psVar25 = (secp256k1_modinv64_modinfo *)((long)(psVar25->modulus).v + 1);
        } while ((int)psVar25 != 0x100);
        lVar19 = 0;
        do {
          if (auStack_170[lVar19] != *(uint16_t *)((long)(modinfo->modulus).v + lVar19 * 2))
          goto LAB_0016ec67;
          lVar19 = lVar19 + 1;
        } while (lVar19 != 0x10);
        uVar29 = (ulong)(iVar16 + 1);
        if (iVar16 != 0) {
          return;
        }
      }
LAB_0016ec6c:
      pcStack_1d8 = (code *)0x16ec71;
      test_modinv64_uint16_cold_3();
      goto LAB_0016ec71;
    }
    pcStack_1d8 = (code *)0x16e82d;
    mulmod256(auStack_170,(uint16_t *)modinfo,(uint16_t *)modinfo,(uint16_t *)m_00);
    sStack_1d0.v[2] = 0;
    sStack_1d0.v[3] = 0;
    sStack_1d0.v[0] = 0;
    sStack_1d0.v[1] = 0;
    sStack_1d0.v[4] = 0;
    uVar30 = 0;
    do {
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar30 >> 1;
      puVar2 = (ulong *)((long)sStack_1d0.v +
                        (ulong)((uint)((uVar30 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) & 0xfffffff8
                               ));
      *puVar2 = *puVar2 | (ulong)((auStack_170[uVar30 >> 4 & 0xfffffff] >> ((uint)uVar30 & 0xf) & 1)
                                 != 0) <<
                          ((char)(SUB164(auVar9 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                           (char)uVar30 & 0x3fU);
      uVar30 = uVar30 + 1;
    } while ((int)uVar30 != 0x100);
    psVar25 = &sStack_1a0;
    pcStack_1d8 = (code *)0x16e8a8;
    uVar15 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar25);
    if (uVar15 < 2) {
      uStack_140 = *(uint16_t *)m_00 - 1;
      uStack_13e = *(undefined8 *)(m_00 + 2);
      uStack_128 = *(undefined8 *)(m_00 + 0x18);
      uStack_136 = (undefined6)*(undefined8 *)(m_00 + 10);
      uStack_130 = (undefined2)*(undefined8 *)(m_00 + 0x10);
      uStack_12e = (undefined6)((ulong)*(undefined8 *)(m_00 + 0x10) >> 0x10);
      pcStack_1d8 = (code *)0x16e8e1;
      mulmod256(auStack_170,auStack_170,&uStack_140,(uint16_t *)m_00);
      sStack_1d0.v[2] = 0;
      sStack_1d0.v[3] = 0;
      sStack_1d0.v[0] = 0;
      sStack_1d0.v[1] = 0;
      sStack_1d0.v[4] = 0;
      uVar30 = 0;
      do {
        auVar10._8_8_ = 0;
        auVar10._0_8_ = uVar30 >> 1;
        puVar2 = (ulong *)((long)sStack_1d0.v +
                          (ulong)((uint)((uVar30 >> 1 & 0x7fffffff) * 0x84210843 >> 0x21) &
                                 0xfffffff8));
        *puVar2 = *puVar2 | (ulong)((auStack_170[uVar30 >> 4 & 0xfffffff] >> ((uint)uVar30 & 0xf) &
                                    1) != 0) <<
                            ((char)(SUB164(auVar10 * ZEXT816(0x8421084210842109),8) >> 4) * '\x02' +
                             (char)uVar30 & 0x3fU);
        uVar30 = uVar30 + 1;
      } while ((int)uVar30 != 0x100);
      psVar25 = &sStack_1a0;
      pcStack_1d8 = (code *)0x16e95c;
      iVar16 = secp256k1_jacobi64_maybe_var(&sStack_1d0,psVar25);
      if ((iVar16 != 0) && (iVar16 != 1 - (*(ushort *)m_00 & 2))) goto LAB_0016ec7b;
      goto LAB_0016e975;
    }
  }
  else {
LAB_0016ec71:
    pcStack_1d8 = (code *)0x16ec76;
    test_modinv64_uint16_cold_1();
    psVar26 = (secp256k1_modinv64_signed62 *)out_01;
  }
  psVar27 = psVar26;
  pcStack_1d8 = (code *)0x16ec7b;
  test_modinv64_uint16_cold_6();
LAB_0016ec7b:
  pcStack_1d8 = modinv2p64;
  test_modinv64_uint16_cold_2();
  if (((ulong)psVar27 & 1) != 0) {
    iVar16 = 6;
    do {
      iVar16 = iVar16 + -1;
    } while (iVar16 != 0);
    return;
  }
  pcStack_1e0 = secp256k1_jacobi32_maybe_var;
  modinv2p64_cold_1();
  pcStack_1e0 = (code *)0x8421084210842109;
  psStack_1e8 = a;
  psStack_1f0 = modinfo;
  uStack_1f8 = uVar33;
  uStack_200 = uVar29;
  pcStack_208 = pcVar23;
  sStack_260.v[8] = (int32_t)(psVar25->modulus).v[4];
  sStack_260.v._16_8_ = (psVar25->modulus).v[2];
  sStack_260.v._24_8_ = (psVar25->modulus).v[3];
  sStack_260.v._0_8_ = (psVar25->modulus).v[0];
  sStack_260.v._8_8_ = (psVar25->modulus).v[1];
  sStack_230.v[8] = *(int32_t *)((long)psVar27 + 0x20);
  sStack_230.v._0_8_ = psVar27->v[0];
  sStack_230.v._8_8_ = *(undefined8 *)((long)psVar27 + 8);
  sStack_230.v._16_8_ = *(undefined8 *)((long)psVar27 + 0x10);
  sStack_230.v._24_8_ = *(undefined8 *)((long)psVar27 + 0x18);
  uVar29 = 9;
  iVar32 = -1;
  iVar16 = 0;
  do {
    iVar21 = 0;
    if ((sStack_230.v[0] | 0xc0000000U) != 0) {
      for (; ((sStack_230.v[0] | 0xc0000000U) >> iVar21 & 1) == 0; iVar21 = iVar21 + 1) {
      }
    }
    sStack_278.u = 1 << ((byte)iVar21 & 0x1f);
    iVar32 = iVar32 - iVar21;
    if (iVar21 == 0x1e) {
      iStack_284 = 1;
      sStack_278.q = 0;
      sStack_278.v = 0;
    }
    else {
      uVar15 = sStack_260.v[1] << 0x1e | sStack_260.v[0];
      uVar31 = (uint)(sStack_230.v[1] << 0x1e | sStack_230.v[0]) >> ((byte)iVar21 & 0x1f);
      iVar21 = 0x1e - iVar21;
      iStack_284 = 1;
      sStack_278.v = 0;
      sStack_278.q = 0;
      do {
        iVar34 = sStack_278.u;
        uVar24 = uVar31;
        iVar28 = sStack_278.v;
        if (iVar32 < 0) {
          iVar32 = -iVar32;
          iVar34 = sStack_278.q;
          uVar24 = uVar15;
          uVar15 = uVar31;
          sStack_278.q = sStack_278.u;
          iVar28 = iStack_284;
          iStack_284 = sStack_278.v;
        }
        iVar6 = iVar32 + 1;
        if (iVar21 <= iVar32 + 1) {
          iVar6 = iVar21;
        }
        uVar17 = ((uint)(byte)(secp256k1_modinv32_inv256[uVar15 >> 1 & 0x7f] * (char)uVar24) <<
                 (-(char)iVar6 & 0x1fU)) >> (-(char)iVar6 & 0x1fU);
        uVar24 = uVar17 * uVar15 + uVar24;
        sStack_278.q = uVar17 * iVar34 + sStack_278.q;
        uVar31 = -1 << ((byte)iVar21 & 0x1f) | uVar24;
        iVar6 = 0;
        if (uVar31 != 0) {
          for (; (uVar31 >> iVar6 & 1) == 0; iVar6 = iVar6 + 1) {
          }
        }
        bVar20 = (byte)iVar6;
        uVar31 = uVar24 >> (bVar20 & 0x1f);
        sStack_278.u = iVar34 << (bVar20 & 0x1f);
        sStack_278.v = iVar28 << (bVar20 & 0x1f);
        iStack_284 = uVar17 * iVar28 + iStack_284;
        iVar32 = iVar32 - iVar6;
        iVar21 = iVar21 - iVar6;
      } while (iVar21 != 0);
    }
    uVar15 = (uint)uVar29;
    sStack_278.r = iStack_284;
    uStack_268 = uVar29;
    secp256k1_modinv32_update_fg_30_var(uVar15,&sStack_260,&sStack_230,&sStack_278);
    if (sStack_260.v[0] == 1) {
      if (1 < (int)uVar15) {
        uVar31 = 0;
        uVar30 = 1;
        do {
          uVar31 = uVar31 | sStack_260.v[uVar30];
          uVar30 = uVar30 + 1;
        } while (uVar29 != uVar30);
        if (uVar31 != 0) goto LAB_0016ee90;
      }
      bVar14 = false;
    }
    else {
LAB_0016ee90:
      uVar31 = uVar15 - 1;
      if (((int)(uVar15 - 2) < 0 || *(int *)((long)&uStack_268 + (long)(int)uVar15 * 4 + 4) != 0) ||
          (&iStack_234)[(int)uVar15] != 0) {
        uVar31 = uVar15;
      }
      bVar14 = true;
      uVar29 = (ulong)uVar31;
    }
    if ((!bVar14) || (iVar16 = iVar16 + 1, iVar16 == 0x32)) {
      return;
    }
  } while( true );
LAB_0016e6ad:
  pcStack_f0 = (code *)0x16e6b2;
  test_modinv32_uint16_cold_5();
LAB_0016e6b2:
  pcStack_f0 = (code *)0x16e6b7;
  test_modinv32_uint16_cold_3();
LAB_0016e6b7:
  pcStack_f0 = (code *)0x16e6bc;
  test_modinv32_uint16_cold_1();
  psVar25 = out_00;
LAB_0016e6bc:
  a = psVar25;
  pcStack_f0 = (code *)0x16e6c1;
  test_modinv32_uint16_cold_6();
  goto LAB_0016e6c1;
LAB_0016ec67:
  pcStack_1d8 = (code *)0x16ec6c;
  test_modinv64_uint16_cold_5();
  goto LAB_0016ec6c;
}

Assistant:

static void test_modinv32_uint16(uint16_t* out, const uint16_t* in, const uint16_t* mod) {
    uint16_t tmp[16];
    secp256k1_modinv32_signed30 x;
    secp256k1_modinv32_modinfo m;
    int i, vartime, nonzero;

    uint16_to_signed30(&x, in);
    nonzero = (x.v[0] | x.v[1] | x.v[2] | x.v[3] | x.v[4] | x.v[5] | x.v[6] | x.v[7] | x.v[8]) != 0;
    uint16_to_signed30(&m.modulus, mod);

    /* compute 1/modulus mod 2^30 */
    m.modulus_inv30 = modinv2p64(m.modulus.v[0]) & 0x3fffffff;
    CHECK(((m.modulus_inv30 * m.modulus.v[0]) & 0x3fffffff) == 1);

    /* Test secp256k1_jacobi32_maybe_var. */
    if (nonzero) {
        int jac;
        uint16_t sqr[16], negone[16];
        mulmod256(sqr, in, in, mod);
        uint16_to_signed30(&x, sqr);
        /* Compute jacobi symbol of in^2, which must be 1 (or uncomputable). */
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1);
        /* Then compute the jacobi symbol of -(in^2). x and -x have opposite
         * jacobi symbols if and only if (mod % 4) == 3. */
        negone[0] = mod[0] - 1;
        for (i = 1; i < 16; ++i) negone[i] = mod[i];
        mulmod256(sqr, sqr, negone, mod);
        uint16_to_signed30(&x, sqr);
        jac = secp256k1_jacobi32_maybe_var(&x, &m);
        CHECK(jac == 0 || jac == 1 - (mod[0] & 2));
    }

    uint16_to_signed30(&x, in);
    mutate_sign_signed30(&m.modulus);
    for (vartime = 0; vartime < 2; ++vartime) {
        /* compute inverse */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* produce output */
        signed30_to_uint16(out, &x);

        /* check if the inverse times the input is 1 (mod m), unless x is 0. */
        mulmod256(tmp, out, in, mod);
        CHECK(tmp[0] == nonzero);
        for (i = 1; i < 16; ++i) CHECK(tmp[i] == 0);

        /* invert again */
        (vartime ? secp256k1_modinv32_var : secp256k1_modinv32)(&x, &m);

        /* check if the result is equal to the input */
        signed30_to_uint16(tmp, &x);
        for (i = 0; i < 16; ++i) CHECK(tmp[i] == in[i]);
    }
}